

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

void __thiscall
Snake::UpdateBody(Snake *this,SDL_Point *current_head_cell,SDL_Point *prev_head_cell,
                 Snake *otherSnake)

{
  vector<SDL_Point,_std::allocator<SDL_Point>_> *this_00;
  int iVar1;
  int iVar2;
  pointer pSVar3;
  SDL_Point *item;
  pointer pSVar4;
  ostream *poVar5;
  
  this_00 = &this->body;
  std::vector<SDL_Point,_std::allocator<SDL_Point>_>::push_back(this_00,prev_head_cell);
  if (this->growing == false) {
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::erase
              (this_00,(this_00->super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  }
  else {
    this->growing = false;
    this->size = this->size + 1;
  }
  pSVar3 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = current_head_cell->x;
  iVar2 = current_head_cell->y;
  for (pSVar4 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar3; pSVar4 = pSVar4 + 1) {
    if ((iVar1 == pSVar4->x) && (iVar2 == pSVar4->y)) {
      this->alive = false;
    }
  }
  pSVar3 = (otherSnake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = current_head_cell->x;
  iVar2 = current_head_cell->y;
  for (pSVar4 = (otherSnake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl
                .super__Vector_impl_data._M_start; pSVar4 != pSVar3; pSVar4 = pSVar4 + 1) {
    if ((iVar1 == pSVar4->x) && (iVar2 == pSVar4->y)) {
      this->alive = false;
    }
  }
  if ((current_head_cell->x == (int)otherSnake->head_x) && (iVar2 == (int)otherSnake->head_y)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"snakes collided");
    std::endl<char,std::char_traits<char>>(poVar5);
    this->alive = false;
  }
  return;
}

Assistant:

void Snake::UpdateBody(SDL_Point &current_head_cell, SDL_Point &prev_head_cell, Snake otherSnake) {
  // Add previous head location to vector
  body.push_back(prev_head_cell);

  if (!growing) {
    // Remove the tail from the vector.
    body.erase(body.begin());
  } else {
    growing = false;
    size++;
  }
  
  // Check if the snake has died.
  /*hiiting himself*/
  for (auto const &item : body) {
    if (current_head_cell.x == static_cast<int>(item.x) && current_head_cell.y == static_cast<int>(item.y)) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's body*/
  for (auto const &item : otherSnake.body) {
   if (current_head_cell.x == item.x && current_head_cell.y == item.y) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's head*/
  if (current_head_cell.x == static_cast<int>(otherSnake.head_x) && current_head_cell.y == static_cast<int>(otherSnake.head_y)) {
      std::cout << "snakes collided" << std::endl;
      alive = false;
  }
}